

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

bool __thiscall
Shell::Options::OptionValue<Shell::Options::TermOrdering>::checkConstraints
          (OptionValue<Shell::Options::TermOrdering> *this)

{
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  Mode MVar4;
  BadOption BVar5;
  pointer pOVar6;
  undefined8 uVar7;
  long in_RDI;
  OptionValueConstraintUP<Shell::Options::TermOrdering> *con;
  RefIterator it;
  string *in_stack_fffffffffffffdd8;
  UserErrorException *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  undefined1 local_b8 [67];
  undefined1 local_75;
  undefined1 local_68 [64];
  unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>_>_>
  *local_28;
  RefIterator local_20 [2];
  
  Lib::
  Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>_>_>_>
  ::RefIterator::RefIterator
            (local_20,(Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>_>_>_>
                       *)(in_RDI + 0xa0));
  do {
    bVar1 = Lib::
            Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>_>_>_>
            ::RefIterator::hasNext(local_20);
    if (!bVar1) {
      return true;
    }
    local_28 = Lib::
               Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>_>_>_>
               ::RefIterator::next(local_20);
    pOVar6 = std::
             unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>_>_>
             ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>_>_>
                           *)0xc5e858);
    uVar3 = (*pOVar6->_vptr_OptionValueConstraint[2])(pOVar6,in_RDI);
  } while ((uVar3 & 1) != 0);
  MVar4 = mode(Lib::env);
  if (MVar4 != SPIDER) {
    pOVar6 = std::
             unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>_>_>
             ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>_>_>
                           *)0xc5e9a3);
    bVar1 = OptionValueConstraint<Shell::Options::TermOrdering>::isHard(pOVar6);
    if (bVar1) {
      uVar7 = __cxa_allocate_exception(0x50);
      pOVar6 = std::
               unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>_>_>
               ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>_>_>
                             *)0xc5e9d8);
      (*pOVar6->_vptr_OptionValueConstraint[3])(local_b8,pOVar6,in_RDI);
      std::operator+(in_stack_fffffffffffffde8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffde0);
      Lib::UserErrorException::Exception(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      __cxa_throw(uVar7,&Lib::UserErrorException::typeinfo,
                  Lib::UserErrorException::~UserErrorException);
    }
    BVar5 = getBadOptionChoice(Lib::env);
    uVar2 = (*(code *)(&DAT_00f09068 + *(int *)(&DAT_00f09068 + (ulong)BVar5 * 4)))();
    return (bool)uVar2;
  }
  reportSpiderFail();
  local_75 = 1;
  uVar7 = __cxa_allocate_exception(0x50);
  pOVar6 = std::
           unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>_>_>
           ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::TermOrdering>_>_>
                         *)0xc5e8af);
  (*pOVar6->_vptr_OptionValueConstraint[3])(local_68,pOVar6,in_RDI);
  std::operator+(in_stack_fffffffffffffde8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffde0);
  Lib::UserErrorException::Exception(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  local_75 = 0;
  __cxa_throw(uVar7,&Lib::UserErrorException::typeinfo,Lib::UserErrorException::~UserErrorException)
  ;
}

Assistant:

bool Options::OptionValue<T>::checkConstraints()
{
  typename Lib::Stack<OptionValueConstraintUP<T>>::RefIterator it(_constraints);
  while (it.hasNext()) {
    const OptionValueConstraintUP<T> &con = it.next();
    if (!con->check(*this)) {

      if (env.options->mode() == Mode::SPIDER) {
      reportSpiderFail();
      USER_ERROR("\nBroken Constraint: " + con->msg(*this));
      }

      if (con->isHard()) {
        USER_ERROR("\nBroken Constraint: " + con->msg(*this));
      }
      switch (env.options->getBadOptionChoice()) {
      case BadOption::HARD:
        USER_ERROR("\nBroken Constraint: " + con->msg(*this));
      case BadOption::SOFT:
        cout << "WARNING Broken Constraint: " + con->msg(*this) << endl;
        return false;
      case BadOption::FORCED:
        if (con->force(this)) {
          cout << "Forced constraint " + con->msg(*this) << endl;
          break;
        }
        else {
          USER_ERROR("\nCould not force Constraint: " + con->msg(*this));
        }
      case BadOption::OFF:
        return false;
      default:
        ASSERTION_VIOLATION;
      }
    }
  }
  return true;
}